

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDirectDemo_ls.c
# Opt level: O2

void PrintOutput2(sunrealtype t,sunrealtype erm,int qu,sunrealtype hu)

{
  printf("%10.3f  %12.4e   %2d   %12.4e\n",qu);
  return;
}

Assistant:

static void PrintOutput2(sunrealtype t, sunrealtype erm, int qu, sunrealtype hu)
{
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%10.3Lf  %12.4Le   %2d   %12.4Le\n", t, erm, qu, hu);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%10.3f  %12.4e   %2d   %12.4e\n", t, erm, qu, hu);
#else
  printf("%10.3f  %12.4e   %2d   %12.4e\n", t, erm, qu, hu);
#endif

  return;
}